

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall
Memory::Recycler::TryMarkInterior(Recycler *this,void *candidate,void *parentReference)

{
  size_t *psVar1;
  undefined4 *puVar2;
  Recycler *pRVar3;
  Node *pNVar4;
  code *pcVar5;
  bool bVar6;
  undefined8 *in_FS_OFFSET;
  
  if (this->isHeapEnumInProgress == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x853,"(!isHeapEnumInProgress)","!isHeapEnumInProgress");
    if (!bVar6) goto LAB_0026a5de;
    *puVar2 = 0;
  }
  if ((this->collectionState).value == CollectionStateParallelMark) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x855,"(this->collectionState != CollectionStateParallelMark)",
                       "this->collectionState != CollectionStateParallelMark");
    if (!bVar6) goto LAB_0026a5de;
    *puVar2 = 0;
  }
  if (((this->markContext).recycler)->isProcessingRescan == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.inl"
                       ,0xa3,"(!recycler->isProcessingRescan)","!recycler->isProcessingRescan");
    if (!bVar6) {
LAB_0026a5de:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar2 = 0;
  }
  pRVar3 = (this->markContext).recycler;
  if (candidate < (void *)0x10000) {
    LOCK();
    psVar1 = &(pRVar3->collectionStats).tryMarkNullCount;
    *(int *)psVar1 = (int)*psVar1 + 1;
    UNLOCK();
  }
  else {
    for (pNVar4 = (pRVar3->heapBlockMap).list; pNVar4 != (Node *)0x0; pNVar4 = pNVar4->next) {
      if (pNVar4->nodeIndex == (uint)((ulong)candidate >> 0x20)) {
        HeapBlockMap32::MarkInterior<false,false>(&pNVar4->map,candidate,&this->markContext);
        return;
      }
    }
  }
  return;
}

Assistant:

void
Recycler::TryMarkInterior(void* candidate, void* parentReference)
{
#ifdef HEAP_ENUMERATION_VALIDATION
    Assert(!isHeapEnumInProgress || this->IsPostEnumHeapValidationInProgress());
#else
    Assert(!isHeapEnumInProgress);
#endif
    Assert(this->collectionState != CollectionStateParallelMark);
    markContext.Mark</*parallel */ false, /* interior */ true, /* doSpecialMark */ false>(candidate, parentReference);
}